

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
eigenSolver(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
           vector<double,_std::allocator<double>_> *coeffA)

{
  Index *other;
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  size_type sVar4;
  DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *this;
  TransposeReturnType local_198;
  Stride<0,_0> local_17a;
  undefined1 local_178 [8];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> mapRR;
  non_const_type local_150 [3];
  undefined1 local_138 [8];
  PolynomialSolver<double,__1> psolve;
  undefined1 local_28 [8];
  VectorXd coeff;
  vector<double,_std::allocator<double>_> *coeffA_local;
  vector<double,_std::allocator<double>_> *realRoots;
  
  coeff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)coeffA;
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(coeffA);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"eigen solver begin");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pdVar3 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)
                        coeff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows);
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)
                       coeff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows);
    other = &psolve.m_eigenSolver.m_tmp.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Map
              ((ConstMapType *)other,pdVar3,sVar4);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_28,
               (EigenBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)other);
    Eigen::PolynomialSolver<double,-1>::PolynomialSolver<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PolynomialSolver<double,_1> *)local_138,(Matrix<double,__1,_1,_0,__1,_1> *)local_28)
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"Complex roots: ");
    this = (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
           Eigen::PolynomialSolverBase<double,_-1>::roots
                     ((PolynomialSolverBase<double,__1> *)local_138);
    local_150[0] = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>::
                   transpose(this);
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                                       *)local_150);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
    mapRR._16_8_ = Eigen::NumTraits<double>::dummy_precision();
    Eigen::PolynomialSolverBase<double,-1>::realRoots<std::vector<double,std::allocator<double>>>
              ((PolynomialSolverBase<double,_1> *)local_138,__return_storage_ptr__,
               (RealScalar *)&mapRR.field_0x10);
    pdVar3 = std::vector<double,_std::allocator<double>_>::data(__return_storage_ptr__);
    sVar4 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
    Eigen::Stride<0,_0>::Stride(&local_17a);
    Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_178,
               pdVar3,sVar4,&local_17a);
    poVar2 = std::operator<<((ostream *)&std::cout,"Real roots: ");
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose(&local_198,
              (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)local_178);
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                       *)&local_198);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"eigen solver end");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Eigen::PolynomialSolver<double,_-1>::~PolynomialSolver
              ((PolynomialSolver<double,__1> *)local_138);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> eigenSolver(const std::vector<double>& coeffA)
{
    if (coeffA.empty())
        return {};

    std::cout<<"eigen solver begin"<<std::endl;
    using namespace Eigen;
    VectorXd coeff =  VectorXd::Map(coeffA.data(), coeffA.size());

    Eigen::PolynomialSolver<double, Eigen::Dynamic> psolve(coeff);
    std::cout << "Complex roots: " << psolve.roots().transpose() << std::endl;
    std::vector<double> realRoots;
    psolve.realRoots( realRoots );
    Map<VectorXd> mapRR(realRoots.data(), realRoots.size());
    std::cout << "Real roots: " << mapRR.transpose() << std::endl;
    std::cout<<"eigen solver end"<<std::endl;
    return realRoots;
}